

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorGraph.hpp
# Opt level: O3

void __thiscall CoreML::LayerNode::LayerNode(LayerNode *this,NeuralNetworkLayer *layer)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  Rep *pRVar5;
  void **ppvVar6;
  long lVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (this->children).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parents).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->children).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parents).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parents).super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->inputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar5 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    pRVar5 = (Rep *)pRVar5->elements;
  }
  lVar7 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar7 != 0) {
    lVar4 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_48,*(value_type **)((long)pRVar5->elements + lVar4 + -8));
      lVar4 = lVar4 + 8;
    } while (lVar7 * 8 != lVar4);
  }
  pRVar5 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar5->elements;
  if (pRVar5 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  lVar7 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar7 != 0) {
    lVar4 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_68,*(value_type **)((long)ppvVar6 + lVar4));
      lVar4 = lVar4 + 8;
    } while (lVar7 * 8 != lVar4);
  }
  this->layerType = layer->_oneof_case_[0];
  this->lossLayerType = LOSSLAYERTYPE_NOT_SET;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->inputNames,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->outputNames,&local_68);
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->isUpdatable = layer->isupdatable_;
  bVar2 = true;
  uVar1 = layer->_oneof_case_[0] - 100;
  if (uVar1 < 0x3d) {
    if ((0x1000010000100001U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_004f42f4;
    if ((ulong)uVar1 != 0x1e) goto LAB_004f42ea;
    uVar3 = (ulong)*(uint *)((long)&(((layer->layer_).convolution_)->kernelsize_).rep_ + 4);
    if ((uVar3 < 0x29) && ((0x10040000400U >> (uVar3 & 0x3f) & 1) != 0)) goto LAB_004f42f4;
  }
  else {
LAB_004f42ea:
    if (layer->_oneof_case_[0] == 0x12d) goto LAB_004f42f4;
  }
  bVar2 = false;
LAB_004f42f4:
  this->isBackPropagable = bVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

LayerNode(const Specification::NeuralNetworkLayer *layer)
    {
        std::vector<std::string> inNames;
        std::vector<std::string> outNames;
        for (const auto& elem: layer->input()) {
            inNames.push_back(elem);
        }
        for (const auto& elem: layer->output()) {
            outNames.push_back(elem);
        }
        layerType =  layer->layer_case();
        lossLayerType = Specification::LossLayer::LOSSLAYERTYPE_NOT_SET;
        inputNames = inNames;
        outputNames = outNames;
        name = layer->name();
        isUpdatable = layer->isupdatable();
        isBackPropagable = isLayerSupportedForBackprop(layer);
    }